

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::IssueMessage(cmLocalGenerator *this,MessageType t,string *text)

{
  bool bVar1;
  char *pcVar2;
  cmake *pcVar3;
  string local_f8;
  cmState *local_d8;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_d0;
  PositionType local_c8;
  undefined1 local_c0 [8];
  cmOutputConverter converter;
  Directory local_90;
  undefined1 local_68 [8];
  cmListFileContext lfc;
  string *text_local;
  MessageType t_local;
  cmLocalGenerator *this_local;
  
  lfc.Line = (long)text;
  cmListFileContext::cmListFileContext((cmListFileContext *)local_68);
  cmState::Snapshot::GetDirectory(&local_90,&this->StateSnapshot);
  pcVar2 = cmState::Directory::GetCurrentSource(&local_90);
  std::__cxx11::string::operator=((string *)(lfc.Name.field_2._M_local_buf + 8),pcVar2);
  std::__cxx11::string::operator+=((string *)(lfc.Name.field_2._M_local_buf + 8),"/CMakeLists.txt");
  pcVar3 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
  bVar1 = cmake::GetIsInTryCompile(pcVar3);
  if (!bVar1) {
    local_c8 = (this->StateSnapshot).Position.Position;
    local_d8 = (this->StateSnapshot).State;
    pcStack_d0 = (this->StateSnapshot).Position.Tree;
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_c0,this->StateSnapshot);
    cmOutputConverter::Convert
              (&local_f8,(cmOutputConverter *)local_c0,(string *)((long)&lfc.Name.field_2 + 8),HOME,
               UNCHANGED);
    std::__cxx11::string::operator=
              ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  lfc.FilePath.field_2._8_8_ = 0;
  pcVar3 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
  cmake::IssueMessage(pcVar3,t,(string *)lfc.Line,(cmListFileContext *)local_68,false);
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_68);
  return;
}

Assistant:

void cmLocalGenerator::IssueMessage(cmake::MessageType t,
                                    std::string const& text) const
{
  cmListFileContext lfc;
  lfc.FilePath = this->StateSnapshot.GetDirectory().GetCurrentSource();
  lfc.FilePath += "/CMakeLists.txt";

  if(!this->GlobalGenerator->GetCMakeInstance()->GetIsInTryCompile())
    {
    cmOutputConverter converter(this->StateSnapshot);
    lfc.FilePath = converter.Convert(lfc.FilePath, cmLocalGenerator::HOME);
    }
  lfc.Line = 0;
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(t, text, lfc);
}